

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall
GdlRenderer::DebugXmlClasses(GdlRenderer *this,ofstream *strmOut,string *staPathToCur)

{
  pointer ppGVar1;
  GdlGlyphClassDefn *this_00;
  bool bVar2;
  ulong uVar3;
  int cwGlyphIDs;
  int local_7c;
  string *local_78;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_78 = staPathToCur;
  std::operator<<((ostream *)strmOut,"  <classes>\n");
  for (uVar3 = 0;
      ppGVar1 = (this->m_vpglfc).
                super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
                _M_impl.super__Vector_impl_data._M_start,
      uVar3 < (ulong)((long)(this->m_vpglfc).
                            super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar1 >> 3);
      uVar3 = uVar3 + 1) {
    std::__cxx11::string::string((string *)&local_50,(string *)&ppGVar1[uVar3]->m_staName);
    bVar2 = std::operator==(&local_50,"ANY");
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar2) {
      local_7c = 0;
      this_00 = (this->m_vpglfc).
                super__Vector_base<GdlGlyphClassDefn_*,_std::allocator<GdlGlyphClassDefn_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar3];
      std::__cxx11::string::string((string *)&local_70,(string *)local_78);
      GdlGlyphClassDefn::DebugXmlClasses(this_00,strmOut,&local_7c,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
    }
  }
  std::operator<<((ostream *)strmOut,"  </classes>\n\n");
  return;
}

Assistant:

void GdlRenderer::DebugXmlClasses(std::ofstream & strmOut, std::string staPathToCur)		
{
	strmOut << "  <classes>\n";

	int cwGlyphIDs;
	for (size_t ipglfc = 0; ipglfc < m_vpglfc.size(); ipglfc++)
	{
		if (m_vpglfc[ipglfc]->Name() == "ANY")
			continue;

		cwGlyphIDs = 0;
		m_vpglfc[ipglfc]->DebugXmlClasses(strmOut, cwGlyphIDs, staPathToCur);
	}

	strmOut << "  </classes>\n\n";
}